

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O2

bool __thiscall
TTD::ThreadContextTTD::ResolveIsLongLivedForExtract(ThreadContextTTD *this,TTD_LOG_PTR_ID origId)

{
  bool *pbVar1;
  TTD_LOG_PTR_ID local_18;
  TTD_LOG_PTR_ID origId_local;
  
  origId_local._7_1_ = 0;
  local_18 = origId;
  pbVar1 = JsUtil::
           BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::LookupWithKey<unsigned_long>
                     (&this->m_ttdMayBeLongLivedRoot,&local_18,(bool *)((long)&origId_local + 7));
  return *pbVar1;
}

Assistant:

bool ResolveIsLongLivedForExtract(TTD_LOG_PTR_ID origId) const { return this->m_ttdMayBeLongLivedRoot.LookupWithKey(origId, false); }